

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O2

bool __thiscall
text_subtitles::TextSubtitlesRender::rasterText(TextSubtitlesRender *this,string *text)

{
  pointer ppVar1;
  int iVar2;
  int iVar3;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *j;
  pointer ppVar4;
  int iVar5;
  pointer line;
  iterator __end2;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  int local_110;
  int local_10c;
  int local_108;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  txtParts;
  vector<int,_std::allocator<int>_> xSize;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> fontStack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  SIZE mSize;
  
  memset(this->m_pData,0,(long)this->m_height * (long)this->m_width * 4);
  fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  splitStr_abi_cxx11_(&lines,(text->_M_dataplus)._M_p,'\n');
  Font::operator=(&this->m_initFont,&this->m_font);
  local_108 = 0;
  bVar8 = false;
  for (line = lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      line != lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; line = line + 1) {
    processTxtLine(&txtParts,this,line,&fontStack);
    ppVar1 = txtParts.
             super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = txtParts.
                  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 != txtParts.
                  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      bVar8 = (bool)(bVar8 | ((byte)(ppVar4->first).m_opts & 0x10) >> 4);
    }
    xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar10 = 0;
    iVar5 = 0;
    local_110 = 0;
    local_10c = 0;
    for (ppVar4 = txtParts.
                  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1)
    {
      (*this->_vptr_TextSubtitlesRender[2])(this,ppVar4);
      (*this->_vptr_TextSubtitlesRender[4])(this,&ppVar4->second,&mSize);
      if (iVar10 <= mSize.cy) {
        iVar10 = mSize.cy;
      }
      iVar2 = (*this->_vptr_TextSubtitlesRender[5])(this);
      if (local_110 <= iVar2) {
        local_110 = (*this->_vptr_TextSubtitlesRender[5])(this);
      }
      iVar2 = (*this->_vptr_TextSubtitlesRender[6])(this);
      if (local_10c <= iVar2) {
        local_10c = (*this->_vptr_TextSubtitlesRender[6])(this);
      }
      std::vector<int,_std::allocator<int>_>::push_back(&xSize,&mSize.cx);
      iVar5 = iVar5 + mSize.cx;
    }
    iVar2 = this->m_width;
    iVar7 = 0;
    lVar9 = 0x38;
    uVar6 = 0;
    while( true ) {
      if ((ulong)(((long)txtParts.
                         super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)txtParts.
                        super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x58) <= uVar6) break;
      Font::Font((Font *)&mSize,
                 (Font *)((long)txtParts.
                                super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x38));
      (*this->_vptr_TextSubtitlesRender[2])(this,(Font *)&mSize);
      local_a8 = (iVar2 - iVar5) / 2 + iVar7;
      iVar3 = (*this->_vptr_TextSubtitlesRender[5])(this);
      local_a4 = (*this->_vptr_TextSubtitlesRender[6])(this);
      local_a4 = ((local_110 + local_108) - (iVar3 + local_10c)) + local_a4;
      local_a0._0_4_ = this->m_width;
      local_a0._4_4_ = this->m_height;
      (*this->_vptr_TextSubtitlesRender[7])
                (this,(long)&((txtParts.
                               super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first).m_name._M_dataplus
                             ._M_p + lVar9,&local_a8);
      iVar7 = iVar7 + xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      std::__cxx11::string::~string((string *)&mSize);
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 0x58;
    }
    lVar9 = lroundf((float)iVar10 * (this->m_font).m_lineSpacing);
    local_108 = local_108 + (int)lVar9;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&xSize.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&txtParts);
  }
  (*this->_vptr_TextSubtitlesRender[8])(this);
  Font::operator=(&this->m_font,&this->m_initFont);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::~vector(&fontStack);
  return bVar8;
}

Assistant:

bool TextSubtitlesRender::rasterText(const std::string& text)
{
    bool forced = false;
    memset(m_pData, 0, static_cast<size_t>(m_width) * m_height * 4);
    vector<Font> fontStack;
    const vector<string> lines = splitStr(text.c_str(), '\n');
    int curY = 0;
    m_initFont = m_font;
    for (auto& i : lines)
    {
        vector<pair<Font, string>> txtParts = processTxtLine(i, fontStack);
        for (const auto& j : txtParts)
        {
            if (j.first.m_opts & Font::FORCED)
                forced = true;
        }

        int ySize = 0;
        int tWidth = 0;
        int maxHeight = 0;
        int maxBaseLine = 0;
        vector<int> xSize;
        for (auto& j : txtParts)
        {
            setFont(j.first);
            SIZE mSize;
            getTextSize(j.second, &mSize);
            ySize = FFMAX(ySize, mSize.cy);
            maxHeight = FFMAX(maxHeight, getLineSpacing());
            maxBaseLine = FFMAX(maxBaseLine, getBaseline());
            xSize.push_back(mSize.cx);
            tWidth += mSize.cx;
        }
        const int xOffs = (m_width - tWidth) / 2;
        int curX = 0;
        for (size_t j = 0; j < txtParts.size(); j++)
        {
            Font font(txtParts[j].first);
            setFont(font);

            RECT rect = {curX + xOffs, curY + (maxHeight - getLineSpacing()) - (maxBaseLine - getBaseline()), m_width,
                         m_height};
            drawText(txtParts[j].second, &rect);

            curX += xSize[j];
        }
        curY += lround(static_cast<float>(ySize) * m_font.m_lineSpacing);
    }
    flushRasterBuffer();
    m_font = m_initFont;

    return forced;
}